

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall
QGraphicsScenePrivate::enterModal
          (QGraphicsScenePrivate *this,QGraphicsItem *panel,PanelModality previousModality)

{
  PanelModality PVar1;
  QGraphicsItemPrivate *pQVar2;
  long *plVar3;
  QGraphicsItem *this_00;
  undefined8 uVar4;
  bool bVar5;
  Node<QGraphicsItem_*,_QHashDummyValue> *pNVar6;
  QEvent *event;
  long lVar7;
  long lVar8;
  QGraphicsItem **item;
  QGraphicsItem **key;
  long lVar9;
  long in_FS_OFFSET;
  undefined1 *local_78;
  undefined1 *puStack_70;
  QGraphicsItem *local_68;
  undefined1 *puStack_60;
  undefined1 local_58 [16];
  QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>
  local_48;
  QHash<QGraphicsItem_*,_QHashDummyValue> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar9 = *(long *)&this->field_0x8;
  pQVar2 = (panel->d_ptr).d;
  PVar1 = pQVar2->panelModality;
  if (previousModality != NonModal) {
    pQVar2->panelModality = previousModality;
  }
  local_40.d = (Data *)0x0;
  local_48.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  plVar3 = *(long **)(*(long *)(lVar9 + 8) + 0x88);
  (**(code **)(*plVar3 + 0x60))(local_58,plVar3,1);
  uVar4 = local_58._8_8_;
  if (local_48.d != (QGraphicsSceneEventPrivate *)0x0) {
    lVar8 = (long)local_48.d << 3;
    lVar7 = 0;
    do {
      bVar5 = QGraphicsItem::isPanel(*(QGraphicsItem **)(uVar4 + lVar7));
      if (bVar5) {
        bVar5 = QGraphicsItem::isBlockedByModalPanel
                          (*(QGraphicsItem **)(uVar4 + lVar7),(QGraphicsItem **)0x0);
        if (bVar5) {
          local_68 = *(QGraphicsItem **)(uVar4 + lVar7);
          QHash<QGraphicsItem*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                    ((QHash<QGraphicsItem*,QHashDummyValue> *)&local_40,&local_68,
                     (QHashDummyValue *)&local_78);
        }
      }
      lVar7 = lVar7 + 8;
    } while (lVar8 != lVar7);
  }
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_58._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,8,0x10);
    }
  }
  if (previousModality != NonModal) {
    ((panel->d_ptr).d)->panelModality = PVar1;
    local_58._0_8_ = &local_68;
    local_68 = panel;
    QtPrivate::
    sequential_erase_if<QList<QGraphicsItem*>,QtPrivate::sequential_erase<QList<QGraphicsItem*>,QGraphicsItem*>(QList<QGraphicsItem*>&,QGraphicsItem*const&)::_lambda(auto:1_const&)_1_>
              (&this->modalPanels,(anon_class_8_1_54a39814_for__M_pred *)local_58);
  }
  local_58._0_8_ = panel;
  QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
            ((QPodArrayOps<QGraphicsItem*> *)&this->modalPanels,0,(QGraphicsItem **)local_58);
  if ((this->hoverItems).d.size != 0) {
    local_48.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneHoverEvent::QGraphicsSceneHoverEvent((QGraphicsSceneHoverEvent *)local_58,None);
    QGraphicsSceneHoverEvent::setScenePos
              ((QGraphicsSceneHoverEvent *)local_58,&this->lastSceneMousePos);
    dispatchHoverEvent(this,(QGraphicsSceneHoverEvent *)local_58);
    QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)local_58);
  }
  lVar7 = (this->mouseGrabberItems).d.size;
  if ((lVar7 != 0) && ((this->field_0xb9 & 8) != 0)) {
    this_00 = (this->mouseGrabberItems).d.ptr[lVar7 + -1];
    bVar5 = QGraphicsItem::isBlockedByModalPanel(this_00,(QGraphicsItem **)0x0);
    if (bVar5) {
      ungrabMouse(this,this_00,false);
    }
  }
  local_68 = (QGraphicsItem *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_68,WindowBlocked);
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_78,WindowUnblocked);
  local_48.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  plVar3 = *(long **)(*(long *)(lVar9 + 8) + 0x88);
  (**(code **)(*plVar3 + 0x60))(local_58,plVar3,1);
  if (local_48.d != (QGraphicsSceneEventPrivate *)0x0) {
    lVar9 = (long)local_48.d << 3;
    key = (QGraphicsItem **)local_58._8_8_;
    do {
      bVar5 = QGraphicsItem::isPanel(*key);
      if (bVar5) {
        if (local_40.d == (Data *)0x0) {
LAB_006137c1:
          bVar5 = QGraphicsItem::isBlockedByModalPanel(*key,(QGraphicsItem **)0x0);
          event = (QEvent *)&local_68;
          if (!bVar5) goto LAB_006137d3;
LAB_006137fc:
          sendEvent(this,*key,event);
        }
        else {
          pNVar6 = QHashPrivate::Data<QHashPrivate::Node<QGraphicsItem*,QHashDummyValue>>::
                   findNode<QGraphicsItem*>
                             ((Data<QHashPrivate::Node<QGraphicsItem*,QHashDummyValue>> *)local_40.d
                              ,key);
          if (pNVar6 == (Node<QGraphicsItem_*,_QHashDummyValue> *)0x0) goto LAB_006137c1;
LAB_006137d3:
          if (local_40.d != (Data *)0x0) {
            pNVar6 = QHashPrivate::Data<QHashPrivate::Node<QGraphicsItem*,QHashDummyValue>>::
                     findNode<QGraphicsItem*>
                               ((Data<QHashPrivate::Node<QGraphicsItem*,QHashDummyValue>> *)
                                local_40.d,key);
            if (pNVar6 != (Node<QGraphicsItem_*,_QHashDummyValue> *)0x0) {
              bVar5 = QGraphicsItem::isBlockedByModalPanel(*key,(QGraphicsItem **)0x0);
              event = (QEvent *)&local_78;
              if (!bVar5) goto LAB_006137fc;
            }
          }
        }
      }
      key = key + 1;
      lVar9 = lVar9 + -8;
    } while (lVar9 != 0);
  }
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_58._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,8,0x10);
    }
  }
  QEvent::~QEvent((QEvent *)&local_78);
  QEvent::~QEvent((QEvent *)&local_68);
  QHash<QGraphicsItem_*,_QHashDummyValue>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::enterModal(QGraphicsItem *panel, QGraphicsItem::PanelModality previousModality)
{
    Q_Q(QGraphicsScene);
    Q_ASSERT(panel && panel->isPanel());

    QGraphicsItem::PanelModality panelModality = panel->d_ptr->panelModality;
    if (previousModality != QGraphicsItem::NonModal) {
        // the panel is changing from one modality type to another... temporarily set it back so
        // that blockedPanels is populated correctly
        panel->d_ptr->panelModality = previousModality;
    }

    QSet<QGraphicsItem *> blockedPanels;
    {
        const auto items_ = q->items();
        for (const auto &item : items_) {
            if (item->isPanel() && item->isBlockedByModalPanel())
                blockedPanels.insert(item);
        }
    }
    // blockedPanels contains all currently blocked panels

    if (previousModality != QGraphicsItem::NonModal) {
        // reset the modality to the proper value, since we changed it above
        panel->d_ptr->panelModality = panelModality;
        // remove this panel so that it will be reinserted at the front of the stack
        modalPanels.removeAll(panel);
    }

    modalPanels.prepend(panel);

    if (!hoverItems.isEmpty()) {
        // send GraphicsSceneHoverLeave events to newly blocked hoverItems
        QGraphicsSceneHoverEvent hoverEvent;
        hoverEvent.setScenePos(lastSceneMousePos);
        dispatchHoverEvent(&hoverEvent);
    }

    if (!mouseGrabberItems.isEmpty() && lastMouseGrabberItemHasImplicitMouseGrab) {
        QGraphicsItem *item = mouseGrabberItems.constLast();
        if (item->isBlockedByModalPanel())
            ungrabMouse(item, /*itemIsDying =*/ false);
    }

    QEvent windowBlockedEvent(QEvent::WindowBlocked);
    QEvent windowUnblockedEvent(QEvent::WindowUnblocked);
    const auto items_ = q->items();
    for (const auto &item : items_) {
        if (item->isPanel()) {
            if (!blockedPanels.contains(item) && item->isBlockedByModalPanel()) {
                // send QEvent::WindowBlocked to newly blocked panels
                sendEvent(item, &windowBlockedEvent);
            } else if (blockedPanels.contains(item) && !item->isBlockedByModalPanel()) {
                // send QEvent::WindowUnblocked to unblocked panels when downgrading
                // a panel from SceneModal to PanelModal
                sendEvent(item, &windowUnblockedEvent);
            }
        }
    }
}